

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<float>
          (AsciiParser *this,char sep,vector<float,_std::allocator<float>_> *result)

{
  pointer pfVar1;
  iterator iVar2;
  bool bVar3;
  StreamReader *pSVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  float value;
  float value_1;
  float local_4c;
  string local_48;
  
  pfVar1 = (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pfVar1) {
    (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pfVar1;
  }
  bVar3 = SkipWhitespaceAndNewline(this,true);
  if (bVar3) {
    bVar3 = ReadBasicType(this,&local_4c);
    if (bVar3) {
      iVar2._M_current =
           (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)result,iVar2,&local_4c);
      }
      else {
        *iVar2._M_current = local_4c;
        (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      pSVar4 = this->_sr;
      uVar5 = pSVar4->idx_;
      if (uVar5 < pSVar4->length_) {
        while (pSVar4->binary_[uVar5] != '\0') {
          bVar3 = SkipWhitespaceAndNewline(this,true);
          if (!bVar3) {
            return false;
          }
          bVar3 = Char1(this,(char *)&local_4c);
          if (!bVar3) {
            return false;
          }
          if (local_4c._0_1_ != sep) {
            pSVar4 = this->_sr;
            if ((0 < (long)pSVar4->idx_) && (uVar5 = pSVar4->idx_ - 1, uVar5 <= pSVar4->length_)) {
              pSVar4->idx_ = uVar5;
            }
            break;
          }
          bVar3 = SkipWhitespaceAndNewline(this,true);
          if (!bVar3) {
            return false;
          }
          bVar3 = ReadBasicType(this,(float *)&local_48);
          if (!bVar3) break;
          iVar2._M_current =
               (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)result,iVar2,(float *)&local_48);
          }
          else {
            *iVar2._M_current = local_48._M_dataplus._M_p._0_4_;
            (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          pSVar4 = this->_sr;
          uVar5 = pSVar4->idx_;
          if (pSVar4->length_ <= uVar5) break;
        }
      }
      if ((result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_start !=
          (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        return true;
      }
      pcVar7 = "Empty array.\n";
      pcVar6 = "";
    }
    else {
      pcVar7 = "Not starting with the value of requested type.\n";
      pcVar6 = "";
    }
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,pcVar7,pcVar6);
    PushError(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    // sep
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}